

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O1

int PixarLogGuessDataFmt(TIFFDirectory *td)

{
  uint16_t uVar1;
  int iVar2;
  
  uVar1 = td->td_sampleformat;
  iVar2 = -1;
  switch(td->td_bitspersample) {
  case 8:
    iVar2 = -(uint)(uVar1 != 1 && uVar1 != 4);
    break;
  case 9:
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
    break;
  case 0xb:
    return -(uint)(uVar1 != 1 && uVar1 != 4) | 2;
  case 0xc:
    return -(uint)((uVar1 - 2 & 0xfffd) != 0) | 3;
  case 0x10:
    return -(uint)(uVar1 != 1 && uVar1 != 4) | 4;
  default:
    if (td->td_bitspersample == 0x20) {
      return -(uint)(uVar1 != 3) | 5;
    }
  }
  return iVar2;
}

Assistant:

static int PixarLogGuessDataFmt(TIFFDirectory *td)
{
    int guess = PIXARLOGDATAFMT_UNKNOWN;
    int format = td->td_sampleformat;

    /* If the user didn't tell us his datafmt,
     * take our best guess from the bitspersample.
     */
    switch (td->td_bitspersample)
    {
        case 32:
            if (format == SAMPLEFORMAT_IEEEFP)
                guess = PIXARLOGDATAFMT_FLOAT;
            break;
        case 16:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_UINT)
                guess = PIXARLOGDATAFMT_16BIT;
            break;
        case 12:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_INT)
                guess = PIXARLOGDATAFMT_12BITPICIO;
            break;
        case 11:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_UINT)
                guess = PIXARLOGDATAFMT_11BITLOG;
            break;
        case 8:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_UINT)
                guess = PIXARLOGDATAFMT_8BIT;
            break;
    }

    return guess;
}